

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsparser.cc
# Opt level: O0

int ctemplate_htmlparser::jsparser_buffer_absolute_pos(jsparser_ctx *js,int pos)

{
  int local_24;
  int local_20;
  int buffer_len;
  int absolute_pos;
  int pos_local;
  jsparser_ctx *js_local;
  
  if (pos < 0) {
    if (pos < -0x11) {
      js_local._4_4_ = -1;
    }
    else {
      local_24 = js->buffer_end - js->buffer_start;
      if (local_24 < 0) {
        local_24 = local_24 + 0x12;
      }
      if (SBORROW4(pos,-local_24) == pos + local_24 < 0) {
        local_20 = (pos + js->buffer_end) % 0x12;
        if (local_20 < 0) {
          local_20 = local_20 + 0x12;
        }
        js_local._4_4_ = local_20;
      }
      else {
        js_local._4_4_ = -1;
      }
    }
    return js_local._4_4_;
  }
  __assert_fail("pos < 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/jsparser.cc"
                ,0xd4,"int ctemplate_htmlparser::jsparser_buffer_absolute_pos(jsparser_ctx *, int)")
  ;
}

Assistant:

static inline int jsparser_buffer_absolute_pos(jsparser_ctx *js, int pos)
{
  int absolute_pos;
  int buffer_len;
  assert(pos < 0);

  if(pos <= -JSPARSER_RING_BUFFER_SIZE) {
    return -1;
  }

  buffer_len = js->buffer_end - js->buffer_start;
  if (buffer_len < 0) {
    buffer_len += JSPARSER_RING_BUFFER_SIZE;
  }

  if (pos < -buffer_len) {
    return -1;
  }

  absolute_pos = (pos + js->buffer_end) % JSPARSER_RING_BUFFER_SIZE;
  if (absolute_pos < 0) {
    absolute_pos += JSPARSER_RING_BUFFER_SIZE;
  }

  return absolute_pos;
}